

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.cpp
# Opt level: O1

SNMPPacket * GenerateTestSNMPRequestPacket(void)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  SNMPPacket *this;
  snmp_request_id_t RequestId;
  deque<VarBind,_std::allocator<VarBind>_> *this_00;
  shared_ptr<BER_CONTAINER> local_a8;
  SortableOIDType *local_98;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_90;
  shared_ptr<OIDType> local_88;
  undefined1 local_71;
  VarBind local_70;
  OctetType *local_40;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_38;
  
  this = (SNMPPacket *)operator_new(0xd8);
  SNMPPacket::SNMPPacket(this);
  SNMPPacket::setPDUType(this,GetRequestPDU);
  local_70.oid.super___shared_ptr<OIDType,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)&local_70.type;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"public","");
  SNMPPacket::setCommunityString(this,(string *)&local_70);
  if (local_70.oid.super___shared_ptr<OIDType,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)&local_70.type) {
    operator_delete(local_70.oid.super___shared_ptr<OIDType,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  }
  RequestId = random();
  SNMPPacket::setRequestID(this,RequestId);
  SNMPPacket::setVersion(this,SNMP_VERSION_1);
  local_98 = (SortableOIDType *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<SortableOIDType,std::allocator<SortableOIDType>,char_const(&)[17]>
            (&_Stack_90,&local_98,(allocator<SortableOIDType> *)&local_a8,
             (char (*) [17])".1.3.6.1.4.1.5.1");
  local_88.super___shared_ptr<OIDType,_(__gnu_cxx::_Lock_policy)2>._M_ptr = &local_98->super_OIDType
  ;
  local_88.super___shared_ptr<OIDType,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Stack_90._M_pi;
  local_98 = (SortableOIDType *)0x0;
  _Stack_90._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_a8.super___shared_ptr<BER_CONTAINER,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x28);
  this_00 = &this->varbindList;
  (local_a8.super___shared_ptr<BER_CONTAINER,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
  _M_use_count = 1;
  (local_a8.super___shared_ptr<BER_CONTAINER,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
  _M_weak_count = 1;
  (local_a8.super___shared_ptr<BER_CONTAINER,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
  _vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_001a2dd0;
  local_a8.super___shared_ptr<BER_CONTAINER,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       (local_a8.super___shared_ptr<BER_CONTAINER,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi + 1
       );
  local_a8.super___shared_ptr<BER_CONTAINER,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[1].
  _M_use_count = 2;
  local_a8.super___shared_ptr<BER_CONTAINER,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[1].
  _M_weak_count = 0;
  local_a8.super___shared_ptr<BER_CONTAINER,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[1].
  _vptr__Sp_counted_base = (_func_int **)&PTR__BER_CONTAINER_001a45f0;
  *(undefined4 *)
   &local_a8.super___shared_ptr<BER_CONTAINER,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[2].
    _vptr__Sp_counted_base = 0x2a;
  VarBind::VarBind(&local_70,&local_88,&local_a8);
  Catch::clara::std::deque<VarBind,_std::allocator<VarBind>_>::emplace_back<VarBind>
            ((deque<VarBind,_std::allocator<VarBind>_> *)this_00,&local_70);
  if (local_70.value.super___shared_ptr<BER_CONTAINER,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    Catch::clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_70.value.super___shared_ptr<BER_CONTAINER,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_70.oid.super___shared_ptr<OIDType,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    Catch::clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_70.oid.super___shared_ptr<OIDType,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_a8.super___shared_ptr<BER_CONTAINER,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    Catch::clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_a8.super___shared_ptr<BER_CONTAINER,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_88.super___shared_ptr<OIDType,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    Catch::clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_88.super___shared_ptr<OIDType,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  if (_Stack_90._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    Catch::clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Stack_90._M_pi);
  }
  local_98 = (SortableOIDType *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<SortableOIDType,std::allocator<SortableOIDType>,char_const(&)[17]>
            (&_Stack_90,&local_98,(allocator<SortableOIDType> *)&local_a8,
             (char (*) [17])".1.3.6.1.4.1.5.2");
  local_88.super___shared_ptr<OIDType,_(__gnu_cxx::_Lock_policy)2>._M_ptr = &local_98->super_OIDType
  ;
  local_88.super___shared_ptr<OIDType,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Stack_90._M_pi;
  local_98 = (SortableOIDType *)0x0;
  _Stack_90._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_40 = (OctetType *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<OctetType,std::allocator<OctetType>,char_const(&)[9]>
            (&_Stack_38,&local_40,(allocator<OctetType> *)&local_71,(char (*) [9])"test 123");
  local_a8.super___shared_ptr<BER_CONTAINER,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       &local_40->super_BER_CONTAINER;
  local_a8.super___shared_ptr<BER_CONTAINER,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Stack_38._M_pi;
  local_40 = (OctetType *)0x0;
  _Stack_38._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  VarBind::VarBind(&local_70,&local_88,&local_a8);
  Catch::clara::std::deque<VarBind,_std::allocator<VarBind>_>::emplace_back<VarBind>
            ((deque<VarBind,_std::allocator<VarBind>_> *)this_00,&local_70);
  if (local_70.value.super___shared_ptr<BER_CONTAINER,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    Catch::clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_70.value.super___shared_ptr<BER_CONTAINER,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_70.oid.super___shared_ptr<OIDType,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    Catch::clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_70.oid.super___shared_ptr<OIDType,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_a8.super___shared_ptr<BER_CONTAINER,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    Catch::clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_a8.super___shared_ptr<BER_CONTAINER,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (_Stack_38._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    Catch::clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Stack_38._M_pi);
  }
  if (local_88.super___shared_ptr<OIDType,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    Catch::clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_88.super___shared_ptr<OIDType,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  if (_Stack_90._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    Catch::clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Stack_90._M_pi);
  }
  local_98 = (SortableOIDType *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<SortableOIDType,std::allocator<SortableOIDType>,char_const(&)[27]>
            (&_Stack_90,&local_98,(allocator<SortableOIDType> *)&local_a8,
             (char (*) [27])".1.3.6.1.4.1.52420.9999999");
  local_88.super___shared_ptr<OIDType,_(__gnu_cxx::_Lock_policy)2>._M_ptr = &local_98->super_OIDType
  ;
  local_88.super___shared_ptr<OIDType,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Stack_90._M_pi;
  local_98 = (SortableOIDType *)0x0;
  _Stack_90._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_a8.super___shared_ptr<BER_CONTAINER,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x28);
  (local_a8.super___shared_ptr<BER_CONTAINER,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
  _M_use_count = 1;
  (local_a8.super___shared_ptr<BER_CONTAINER,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
  _M_weak_count = 1;
  (local_a8.super___shared_ptr<BER_CONTAINER,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
  _vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_001a2dd0;
  local_a8.super___shared_ptr<BER_CONTAINER,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       (local_a8.super___shared_ptr<BER_CONTAINER,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi + 1
       );
  local_a8.super___shared_ptr<BER_CONTAINER,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[1].
  _M_use_count = 2;
  local_a8.super___shared_ptr<BER_CONTAINER,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[1].
  _M_weak_count = 0;
  local_a8.super___shared_ptr<BER_CONTAINER,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[1].
  _vptr__Sp_counted_base = (_func_int **)&PTR__BER_CONTAINER_001a45f0;
  *(undefined4 *)
   &local_a8.super___shared_ptr<BER_CONTAINER,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[2].
    _vptr__Sp_counted_base = 0;
  VarBind::VarBind(&local_70,&local_88,&local_a8);
  Catch::clara::std::deque<VarBind,_std::allocator<VarBind>_>::emplace_back<VarBind>
            ((deque<VarBind,_std::allocator<VarBind>_> *)this_00,&local_70);
  if (local_70.value.super___shared_ptr<BER_CONTAINER,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    Catch::clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_70.value.super___shared_ptr<BER_CONTAINER,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_70.oid.super___shared_ptr<OIDType,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    Catch::clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_70.oid.super___shared_ptr<OIDType,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_a8.super___shared_ptr<BER_CONTAINER,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    Catch::clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_a8.super___shared_ptr<BER_CONTAINER,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_88.super___shared_ptr<OIDType,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    Catch::clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_88.super___shared_ptr<OIDType,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  if (_Stack_90._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    Catch::clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Stack_90._M_pi);
  }
  local_98 = (SortableOIDType *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<SortableOIDType,std::allocator<SortableOIDType>,char_const(&)[17]>
            (&_Stack_90,&local_98,(allocator<SortableOIDType> *)&local_a8,
             (char (*) [17])".1.3.6.1.4.1.5.3");
  local_88.super___shared_ptr<OIDType,_(__gnu_cxx::_Lock_policy)2>._M_ptr = &local_98->super_OIDType
  ;
  local_88.super___shared_ptr<OIDType,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Stack_90._M_pi;
  local_98 = (SortableOIDType *)0x0;
  _Stack_90._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_a8.super___shared_ptr<BER_CONTAINER,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x28);
  (local_a8.super___shared_ptr<BER_CONTAINER,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
  _M_use_count = 1;
  (local_a8.super___shared_ptr<BER_CONTAINER,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
  _M_weak_count = 1;
  (local_a8.super___shared_ptr<BER_CONTAINER,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
  _vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_001a2dd0;
  local_a8.super___shared_ptr<BER_CONTAINER,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       (local_a8.super___shared_ptr<BER_CONTAINER,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi + 1
       );
  local_a8.super___shared_ptr<BER_CONTAINER,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[1].
  _M_use_count = 2;
  local_a8.super___shared_ptr<BER_CONTAINER,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[1].
  _M_weak_count = 0;
  local_a8.super___shared_ptr<BER_CONTAINER,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[1].
  _vptr__Sp_counted_base = (_func_int **)&PTR__BER_CONTAINER_001a45f0;
  *(undefined4 *)
   &local_a8.super___shared_ptr<BER_CONTAINER,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[2].
    _vptr__Sp_counted_base = 0xffffffd6;
  VarBind::VarBind(&local_70,&local_88,&local_a8);
  Catch::clara::std::deque<VarBind,_std::allocator<VarBind>_>::emplace_back<VarBind>
            ((deque<VarBind,_std::allocator<VarBind>_> *)this_00,&local_70);
  if (local_70.value.super___shared_ptr<BER_CONTAINER,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    Catch::clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_70.value.super___shared_ptr<BER_CONTAINER,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_70.oid.super___shared_ptr<OIDType,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    Catch::clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_70.oid.super___shared_ptr<OIDType,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_a8.super___shared_ptr<BER_CONTAINER,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    Catch::clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_a8.super___shared_ptr<BER_CONTAINER,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_88.super___shared_ptr<OIDType,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    Catch::clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_88.super___shared_ptr<OIDType,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  if (_Stack_90._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    Catch::clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Stack_90._M_pi);
  }
  local_98 = (SortableOIDType *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<SortableOIDType,std::allocator<SortableOIDType>,char_const(&)[17]>
            (&_Stack_90,&local_98,(allocator<SortableOIDType> *)&local_a8,
             (char (*) [17])".1.3.6.1.4.1.5.4");
  local_88.super___shared_ptr<OIDType,_(__gnu_cxx::_Lock_policy)2>._M_ptr = &local_98->super_OIDType
  ;
  local_88.super___shared_ptr<OIDType,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Stack_90._M_pi;
  local_98 = (SortableOIDType *)0x0;
  _Stack_90._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_a8.super___shared_ptr<BER_CONTAINER,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x28);
  (local_a8.super___shared_ptr<BER_CONTAINER,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
  _M_use_count = 1;
  (local_a8.super___shared_ptr<BER_CONTAINER,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
  _M_weak_count = 1;
  (local_a8.super___shared_ptr<BER_CONTAINER,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
  _vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_001a2dd0;
  local_a8.super___shared_ptr<BER_CONTAINER,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       (local_a8.super___shared_ptr<BER_CONTAINER,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi + 1
       );
  local_a8.super___shared_ptr<BER_CONTAINER,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[1].
  _M_use_count = 2;
  local_a8.super___shared_ptr<BER_CONTAINER,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[1].
  _M_weak_count = 0;
  local_a8.super___shared_ptr<BER_CONTAINER,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[1].
  _vptr__Sp_counted_base = (_func_int **)&PTR__BER_CONTAINER_001a45f0;
  *(undefined4 *)
   &local_a8.super___shared_ptr<BER_CONTAINER,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[2].
    _vptr__Sp_counted_base = 0xfff99760;
  VarBind::VarBind(&local_70,&local_88,&local_a8);
  Catch::clara::std::deque<VarBind,_std::allocator<VarBind>_>::emplace_back<VarBind>
            ((deque<VarBind,_std::allocator<VarBind>_> *)this_00,&local_70);
  if (local_70.value.super___shared_ptr<BER_CONTAINER,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    Catch::clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_70.value.super___shared_ptr<BER_CONTAINER,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_70.oid.super___shared_ptr<OIDType,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    Catch::clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_70.oid.super___shared_ptr<OIDType,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_a8.super___shared_ptr<BER_CONTAINER,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    Catch::clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_a8.super___shared_ptr<BER_CONTAINER,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_88.super___shared_ptr<OIDType,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    Catch::clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_88.super___shared_ptr<OIDType,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  if (_Stack_90._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    Catch::clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Stack_90._M_pi);
  }
  return this;
}

Assistant:

static SNMPPacket* GenerateTestSNMPRequestPacket(){
    SNMPPacket* packet = new SNMPPacket();

    packet->setPDUType(GetRequestPDU);
    packet->setCommunityString("public");
    packet->setRequestID(random());
    packet->setVersion(SNMP_VERSION_1);

    packet->varbindList.push_back(VarBind(std::make_shared<SortableOIDType>(".1.3.6.1.4.1.5.1"),                  std::make_shared<IntegerType>(42)));
    packet->varbindList.push_back(VarBind(std::make_shared<SortableOIDType>(".1.3.6.1.4.1.5.2"),                  std::make_shared<OctetType>("test 123")));
    packet->varbindList.push_back(VarBind(std::make_shared<SortableOIDType>(".1.3.6.1.4.1.52420.9999999"),        std::make_shared<IntegerType>(0)));
    packet->varbindList.push_back(VarBind(std::make_shared<SortableOIDType>(".1.3.6.1.4.1.5.3"),                  std::make_shared<IntegerType>(-42)));
    packet->varbindList.push_back(VarBind(std::make_shared<SortableOIDType>(".1.3.6.1.4.1.5.4"),                  std::make_shared<IntegerType>(-420000)));

    return packet;
}